

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextDiagnosticClient.cpp
# Opt level: O0

void __thiscall
slang::SourceSnippet::highlightRange
          (SourceSnippet *this,SourceRange range,SourceLocation caretLoc,size_t col,
          string_view sourceLine)

{
  size_t sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  size_type sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  const_reference pvVar5;
  size_type sVar6;
  SourceSnippet *in_RDI;
  long in_R8;
  bool bVar7;
  size_t endCol;
  size_t startCol;
  size_t endOfLine;
  size_t startOfLine;
  size_t end;
  size_t start;
  uint6 in_stack_ffffffffffffff48;
  undefined1 uVar8;
  undefined1 uVar9;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff68;
  SourceLocation local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  SourceLocation local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  long local_28;
  SourceLocation local_18;
  SourceRange local_10;
  
  this_00 = (basic_string_view<char,_std::char_traits<char>_> *)&stack0x00000008;
  local_28 = in_R8;
  local_38 = SourceRange::start(&local_10);
  local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             SourceLocation::offset(&local_38);
  local_48 = SourceRange::end(&local_10);
  local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             SourceLocation::offset(&local_48);
  sVar1 = SourceLocation::offset(&local_18);
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (sVar1 - (local_28 + -1));
  __last._M_current = (char *)pbVar2;
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::length(this_00);
  pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __last._M_current)->_M_dataplus)._M_p + sVar3);
  if (local_30 < pbVar2) {
    local_30 = pbVar2;
  }
  if (pbVar4 < local_40) {
    local_40 = pbVar4;
  }
  if (local_40 <= local_30) {
    return;
  }
  local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)local_30 - (long)pbVar2);
  local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)local_40 - (long)pbVar2);
  while( true ) {
    pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       (this_00,(size_type)local_30);
    bVar7 = true;
    if (*pvVar5 != ' ') {
      pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         (this_00,(size_type)local_30);
      bVar7 = *pvVar5 == '\t';
    }
    if (!bVar7) break;
    local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)local_30 + 1);
    if (local_30 == local_40) {
      return;
    }
  }
  uVar9 = 0;
  while( true ) {
    pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       (this_00,(long)local_40 - 1);
    uVar8 = true;
    if (*pvVar5 != ' ') {
      pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         (this_00,(long)local_40 - 1);
      uVar8 = *pvVar5 == '\t';
    }
    if ((bool)uVar8 == false) break;
    local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)local_40 - 1);
    if (local_30 == local_40) {
      return;
    }
  }
  getColumnForByte(in_RDI,CONCAT17(uVar9,(uint7)in_stack_ffffffffffffff48));
  sVar1 = getColumnForByte(in_RDI,CONCAT17(uVar9,CONCAT16(uVar8,in_stack_ffffffffffffff48)));
  sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (&in_RDI->highlightLine);
  if (sVar6 < sVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __last._M_current,(size_type)this_00,(char)((ulong)in_RDI >> 0x38));
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(uVar9,CONCAT16(uVar8,in_stack_ffffffffffffff48)));
  __gnu_cxx::
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::operator+((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)this_00,(difference_type)in_RDI);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(uVar9,CONCAT16(uVar8,in_stack_ffffffffffffff48)));
  __gnu_cxx::
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::operator+((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)this_00,(difference_type)in_RDI);
  std::ranges::__fill_fn::
  operator()<char,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ((__fill_fn *)this_00,in_stack_ffffffffffffff68,__last,(char *)in_RDI);
  return;
}

Assistant:

void highlightRange(SourceRange range, SourceLocation caretLoc, size_t col,
                        std::string_view sourceLine) {
        // Trim the range so that it only falls on the same line as the cursor
        size_t start = range.start().offset();
        size_t end = range.end().offset();
        size_t startOfLine = caretLoc.offset() - (col - 1);
        size_t endOfLine = startOfLine + sourceLine.length();
        if (start < startOfLine)
            start = startOfLine;
        if (end > endOfLine)
            end = endOfLine;

        if (start >= end)
            return;

        // walk the range in to skip any leading or trailing whitespace
        start -= startOfLine;
        end -= startOfLine;
        while (sourceLine[start] == ' ' || sourceLine[start] == '\t') {
            start++;
            if (start == end)
                return;
        }
        while (sourceLine[end - 1] == ' ' || sourceLine[end - 1] == '\t') {
            end--;
            if (start == end)
                return;
        }

        size_t startCol = getColumnForByte(start);
        size_t endCol = getColumnForByte(end);
        SLANG_ASSERT(startCol <= endCol);

        if (highlightLine.size() < endCol)
            highlightLine.resize(endCol, ' ');

        std::ranges::fill(highlightLine.begin() + ptrdiff_t(startCol),
                          highlightLine.begin() + ptrdiff_t(endCol), '~');
    }